

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_file.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  undefined8 in_RAX;
  long lVar3;
  long lVar4;
  undefined8 local_18;
  
  local_18 = in_RAX;
  cVar1 = al_install_system(0x5020700,atexit);
  if (cVar1 == '\0') {
    return 1;
  }
  lVar3 = al_fopen("data/allegro.pcx","rb");
  if (lVar3 != 0) {
    log_printf("\n# line %d\n",0x22);
    iVar2 = al_ftell(lVar3);
    if (iVar2 == 0) {
      log_printf("OK   %s\n","al_ftell(f)");
    }
    else {
      log_printf("FAIL %s\n","al_ftell(f)");
      error = error + 1;
    }
    iVar2 = al_fgetc(lVar3);
    if (iVar2 == 10) {
      log_printf("OK   %s\n","al_fgetc(f)");
    }
    else {
      log_printf("FAIL %s\n","al_fgetc(f)");
      error = error + 1;
    }
    iVar2 = al_fgetc(lVar3);
    if (iVar2 == 5) {
      log_printf("OK   %s\n","al_fgetc(f)");
    }
    else {
      log_printf("FAIL %s\n","al_fgetc(f)");
      error = error + 1;
    }
    lVar4 = al_ftell(lVar3);
    if (lVar4 == 2) {
      log_printf("OK   %s\n","al_ftell(f)");
    }
    else {
      log_printf("FAIL %s\n","al_ftell(f)");
      error = error + 1;
    }
    log_printf("\n# line %d\n",0x29);
    iVar2 = al_fungetc(lVar3,0x55);
    if (iVar2 == 0) {
      log_printf("FAIL %s\n","al_fungetc(f, 0x55)");
      error = error + 1;
    }
    else {
      log_printf("OK   %s\n","al_fungetc(f, 0x55)");
    }
    lVar4 = al_ftell(lVar3);
    if (lVar4 == 1) {
      log_printf("OK   %s\n","al_ftell(f)");
    }
    else {
      log_printf("FAIL %s\n","al_ftell(f)");
      error = error + 1;
    }
    log_printf("\n# line %d\n",0x2e);
    lVar4 = al_fread(lVar3,&local_18,8);
    if (lVar4 == 8) {
      log_printf("OK   %s\n","al_fread(f, bs, sizeof(bs))");
    }
    else {
      log_printf("FAIL %s\n","al_fread(f, bs, sizeof(bs))");
      error = error + 1;
    }
    if ((char)local_18 == 'U') {
      log_printf("OK   %s\n","bs[0]");
    }
    else {
      log_printf("FAIL %s\n","bs[0]");
      error = error + 1;
    }
    if (local_18._1_1_ == '\x01') {
      log_printf("OK   %s\n","bs[1]");
    }
    else {
      log_printf("FAIL %s\n","bs[1]");
      error = error + 1;
    }
    if (local_18._2_1_ == '\b') {
      log_printf("OK   %s\n","bs[2]");
    }
    else {
      log_printf("FAIL %s\n","bs[2]");
      error = error + 1;
    }
    if (local_18._3_1_ == '\0') {
      log_printf("OK   %s\n","bs[3]");
    }
    else {
      log_printf("FAIL %s\n","bs[3]");
      error = error + 1;
    }
    if (local_18._4_1_ == '\0') {
      log_printf("OK   %s\n","bs[4]");
    }
    else {
      log_printf("FAIL %s\n","bs[4]");
      error = error + 1;
    }
    if (local_18._5_1_ == '\0') {
      log_printf("OK   %s\n","bs[5]");
    }
    else {
      log_printf("FAIL %s\n","bs[5]");
      error = error + 1;
    }
    if (local_18._6_1_ == '\0') {
      log_printf("OK   %s\n","bs[6]");
    }
    else {
      log_printf("FAIL %s\n","bs[6]");
      error = error + 1;
    }
    if (local_18._7_1_ == '?') {
      log_printf("OK   %s\n","bs[7]");
    }
    else {
      log_printf("FAIL %s\n","bs[7]");
      error = error + 1;
    }
    lVar4 = al_ftell(lVar3);
    if (lVar4 == 9) {
      log_printf("OK   %s\n","al_ftell(f)");
    }
    else {
      log_printf("FAIL %s\n","al_ftell(f)");
      error = error + 1;
    }
    log_printf("\n# line %d\n",0x3b);
    cVar1 = al_fseek(lVar3,0xd,0);
    if (cVar1 == '\0') {
      log_printf("FAIL %s\n","al_fseek(f, 13, ALLEGRO_SEEK_SET)");
      error = error + 1;
    }
    else {
      log_printf("OK   %s\n","al_fseek(f, 13, ALLEGRO_SEEK_SET)");
    }
    lVar4 = al_ftell(lVar3);
    if (lVar4 == 0xd) {
      log_printf("OK   %s\n","al_ftell(f)");
    }
    else {
      log_printf("FAIL %s\n","al_ftell(f)");
      error = error + 1;
    }
    iVar2 = al_fgetc(lVar3);
    if (iVar2 == 2) {
      log_printf("OK   %s\n","al_fgetc(f)");
    }
    else {
      log_printf("FAIL %s\n","al_fgetc(f)");
      error = error + 1;
    }
    log_printf("\n# line %d\n",0x41);
    cVar1 = al_fseek(lVar3,0,1);
    if (cVar1 == '\0') {
      log_printf("FAIL %s\n","al_fseek(f, 0, ALLEGRO_SEEK_CUR)");
      error = error + 1;
    }
    else {
      log_printf("OK   %s\n","al_fseek(f, 0, ALLEGRO_SEEK_CUR)");
    }
    lVar4 = al_ftell(lVar3);
    if (lVar4 == 0xe) {
      log_printf("OK   %s\n","al_ftell(f)");
    }
    else {
      log_printf("FAIL %s\n","al_ftell(f)");
      error = error + 1;
    }
    iVar2 = al_fgetc(lVar3);
    if (iVar2 == 0xe0) {
      log_printf("OK   %s\n","al_fgetc(f)");
    }
    else {
      log_printf("FAIL %s\n","al_fgetc(f)");
      error = error + 1;
    }
    log_printf("\n# line %d\n",0x47);
    iVar2 = al_fungetc(lVar3,0x55);
    if (iVar2 == 0) {
      log_printf("FAIL %s\n","al_fungetc(f, 0x55)");
      error = error + 1;
    }
    else {
      log_printf("OK   %s\n","al_fungetc(f, 0x55)");
    }
    cVar1 = al_fseek(lVar3,0,1);
    if (cVar1 == '\0') {
      log_printf("FAIL %s\n","al_fseek(f, 0, ALLEGRO_SEEK_CUR)");
      error = error + 1;
    }
    else {
      log_printf("OK   %s\n","al_fseek(f, 0, ALLEGRO_SEEK_CUR)");
    }
    lVar4 = al_ftell(lVar3);
    if (lVar4 == 0xe) {
      log_printf("OK   %s\n","al_ftell(f)");
    }
    else {
      log_printf("FAIL %s\n","al_ftell(f)");
      error = error + 1;
    }
    iVar2 = al_fgetc(lVar3);
    if (iVar2 == 0xe0) {
      log_printf("OK   %s\n","al_fgetc(f)");
    }
    else {
      log_printf("FAIL %s\n","al_fgetc(f)");
      error = error + 1;
    }
    log_printf("\n# line %d\n",0x4e);
    cVar1 = al_fseek(lVar3,0xfffffffffffffffd,1);
    if (cVar1 == '\0') {
      log_printf("FAIL %s\n","al_fseek(f, -3, ALLEGRO_SEEK_CUR)");
      error = error + 1;
    }
    else {
      log_printf("OK   %s\n","al_fseek(f, -3, ALLEGRO_SEEK_CUR)");
    }
    lVar4 = al_ftell(lVar3);
    if (lVar4 == 0xc) {
      log_printf("OK   %s\n","al_ftell(f)");
    }
    else {
      log_printf("FAIL %s\n","al_ftell(f)");
      error = error + 1;
    }
    iVar2 = al_fgetc(lVar3);
    if (iVar2 == 0x80) {
      log_printf("OK   %s\n","al_fgetc(f)");
    }
    else {
      log_printf("FAIL %s\n","al_fgetc(f)");
      error = error + 1;
    }
    log_printf("\n# line %d\n",0x54);
    lVar4 = al_ftell(lVar3);
    if (lVar4 == 0xd) {
      log_printf("OK   %s\n","al_ftell(f)");
    }
    else {
      log_printf("FAIL %s\n","al_ftell(f)");
      error = error + 1;
    }
    iVar2 = al_fungetc(lVar3,0x66);
    if (iVar2 == 0) {
      log_printf("FAIL %s\n","al_fungetc(f, 0x66)");
      error = error + 1;
    }
    else {
      log_printf("OK   %s\n","al_fungetc(f, 0x66)");
    }
    lVar4 = al_ftell(lVar3);
    if (lVar4 == 0xc) {
      log_printf("OK   %s\n","al_ftell(f)");
    }
    else {
      log_printf("FAIL %s\n","al_ftell(f)");
      error = error + 1;
    }
    cVar1 = al_fseek(lVar3,0xfffffffffffffffe,1);
    if (cVar1 == '\0') {
      log_printf("FAIL %s\n","al_fseek(f, -2, ALLEGRO_SEEK_CUR)");
      error = error + 1;
    }
    else {
      log_printf("OK   %s\n","al_fseek(f, -2, ALLEGRO_SEEK_CUR)");
    }
    lVar4 = al_ftell(lVar3);
    if (lVar4 == 10) {
      log_printf("OK   %s\n","al_ftell(f)");
    }
    else {
      log_printf("FAIL %s\n","al_ftell(f)");
      error = error + 1;
    }
    iVar2 = al_fgetc(lVar3);
    if (iVar2 == 199) {
      log_printf("OK   %s\n","al_fgetc(f)");
    }
    else {
      log_printf("FAIL %s\n","al_fgetc(f)");
      error = error + 1;
    }
    log_printf("\n# line %d\n",0x5d);
    cVar1 = al_fseek(lVar3,0,2);
    if (cVar1 == '\0') {
      log_printf("FAIL %s\n","al_fseek(f, 0, ALLEGRO_SEEK_END)");
      error = error + 1;
    }
    else {
      log_printf("OK   %s\n","al_fseek(f, 0, ALLEGRO_SEEK_END)");
    }
    cVar1 = al_feof(lVar3);
    if (cVar1 == '\0') {
      log_printf("OK   %s\n","al_feof(f)");
    }
    else {
      log_printf("FAIL %s\n","al_feof(f)");
      error = error + 1;
    }
    lVar4 = al_ftell(lVar3);
    if (lVar4 == 0xab06) {
      log_printf("OK   %s\n","al_ftell(f)");
    }
    else {
      log_printf("FAIL %s\n","al_ftell(f)");
      error = error + 1;
    }
    log_printf("\n# line %d\n",99);
    iVar2 = al_fgetc(lVar3);
    if (iVar2 == -1) {
      log_printf("OK   %s\n","al_fgetc(f)");
    }
    else {
      log_printf("FAIL %s\n","al_fgetc(f)");
      error = error + 1;
    }
    cVar1 = al_feof(lVar3);
    if (cVar1 == '\0') {
      log_printf("FAIL %s\n","al_feof(f)");
      error = error + 1;
    }
    else {
      log_printf("OK   %s\n","al_feof(f)");
    }
    iVar2 = al_ferror(lVar3);
    if (iVar2 == 0) {
      log_printf("OK   %s\n","al_ferror(f)");
    }
    else {
      log_printf("FAIL %s\n","al_ferror(f)");
      error = error + 1;
    }
    log_printf("\n# line %d\n",0x69);
    cVar1 = al_fseek(lVar3,0,2);
    if (cVar1 == '\0') {
      log_printf("FAIL %s\n","al_fseek(f, 0, ALLEGRO_SEEK_END)");
      error = error + 1;
    }
    else {
      log_printf("OK   %s\n","al_fseek(f, 0, ALLEGRO_SEEK_END)");
    }
    cVar1 = al_feof(lVar3);
    if (cVar1 == '\0') {
      log_printf("OK   %s\n","al_feof(f)");
    }
    else {
      log_printf("FAIL %s\n","al_feof(f)");
      error = error + 1;
    }
    lVar4 = al_ftell(lVar3);
    if (lVar4 == 0xab06) {
      log_printf("OK   %s\n","al_ftell(f)");
    }
    else {
      log_printf("FAIL %s\n","al_ftell(f)");
      error = error + 1;
    }
    log_printf("\n# line %d\n",0x6f);
    cVar1 = al_fseek(lVar3,0xffffffffffffffec,2);
    if (cVar1 == '\0') {
      log_printf("FAIL %s\n","al_fseek(f, -20, ALLEGRO_SEEK_END)");
      error = error + 1;
    }
    else {
      log_printf("OK   %s\n","al_fseek(f, -20, ALLEGRO_SEEK_END)");
    }
    lVar4 = al_ftell(lVar3);
    if (lVar4 == 0xaaf2) {
      log_printf("OK   %s\n","al_ftell(f)");
    }
    else {
      log_printf("FAIL %s\n","al_ftell(f)");
      error = error + 1;
    }
    log_printf("\n# line %d\n",0x74);
    cVar1 = al_fseek(lVar3,0x14,2);
    if (cVar1 == '\0') {
      log_printf("FAIL %s\n","al_fseek(f, 20, ALLEGRO_SEEK_END)");
      error = error + 1;
    }
    else {
      log_printf("OK   %s\n","al_fseek(f, 20, ALLEGRO_SEEK_END)");
    }
    lVar4 = al_ftell(lVar3);
    if (lVar4 == 0xab1a) {
      log_printf("OK   %s\n","al_ftell(f)");
    }
    else {
      log_printf("FAIL %s\n","al_ftell(f)");
      error = error + 1;
    }
    iVar2 = al_fgetc(lVar3);
    if (iVar2 == -1) {
      log_printf("OK   %s\n","al_fgetc(f)");
    }
    else {
      log_printf("FAIL %s\n","al_fgetc(f)");
      error = error + 1;
    }
    cVar1 = al_feof(lVar3);
    if (cVar1 == '\0') {
      log_printf("FAIL %s\n","al_feof(f)");
      error = error + 1;
    }
    else {
      log_printf("OK   %s\n","al_feof(f)");
    }
    log_printf("\n# line %d\n",0x7b);
    iVar2 = al_fsize(lVar3);
    log_printf("OK   %s\n","sz = al_fsize(f)");
    if (iVar2 != -1) {
      if (iVar2 == 0xab06) {
        log_printf("OK   %s\n","sz");
      }
      else {
        log_printf("FAIL %s\n","sz");
        error = error + 1;
      }
    }
    log_printf("\n# line %d\n",0x81);
    cVar1 = al_fclose(lVar3);
    if (cVar1 != '\0') {
      log_printf("OK   %s\n","al_fclose(f)");
      goto LAB_00102198;
    }
    log_printf("FAIL %s\n","al_fclose(f)");
  }
  error = error + 1;
LAB_00102198:
  if (error == 0) {
    return 0;
  }
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
   (void)argc;
   (void)argv;

   if (!al_init())
      return 1;
   init_platform_specific();
   open_log_monospace();

   read_test();

   close_log(true);

   if (error) {
      exit(EXIT_FAILURE);
   }

   return 0;
}